

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

DdNode * GetSingleOutputFunctionRemapped
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdNode **pbVarsEnc,int nVarsEnc)

{
  DdNode *n;
  DdNode *pDVar1;
  DdNode *pDVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  Cudd_AutodynDisable(dd);
  uVar5 = 0;
  uVar4 = 0;
  if (0 < nOuts) {
    uVar4 = (ulong)(uint)nOuts;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    n = Cudd_Support(dd,pOutputs[uVar5]);
    Cudd_Ref(n);
    pDVar1 = dd->one;
    iVar3 = 0;
    for (pDVar2 = n; pDVar2 != pDVar1; pDVar2 = (pDVar2->type).kids.T) {
      GetSingleOutputFunctionRemapped::Permute[pDVar2->index] = iVar3;
      iVar3 = iVar3 + 1;
    }
    pDVar1 = Cudd_bddPermute(dd,pOutputs[uVar5],GetSingleOutputFunctionRemapped::Permute);
    GetSingleOutputFunctionRemapped::pRemapped[uVar5] = pDVar1;
    Cudd_Ref(pDVar1);
    Cudd_RecursiveDeref(dd,n);
  }
  pDVar1 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemapped::pRemapped,nOuts,pbVarsEnc,nVarsEnc);
  Cudd_Ref(pDVar1);
  pDVar2 = Cudd_BddToAdd(dd,pDVar1);
  Cudd_Ref(pDVar2);
  Cudd_RecursiveDeref(dd,pDVar1);
  for (lVar6 = 0; uVar4 * 8 != lVar6; lVar6 = lVar6 + 8) {
    Cudd_RecursiveDeref(dd,*(DdNode **)((long)GetSingleOutputFunctionRemapped::pRemapped + lVar6));
  }
  Cudd_Deref(pDVar2);
  return pDVar2;
}

Assistant:

DdNode * GetSingleOutputFunctionRemapped( DdManager * dd, DdNode ** pOutputs, int nOuts, DdNode ** pbVarsEnc, int nVarsEnc )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    DdNode * bSupp, * bTemp;
    int i, Counter;
    DdNode * bFunc;
    DdNode * aFunc;

    Cudd_AutodynDisable(dd);

    // perform the remapping
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = Counter++;

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );
    }
    
    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );

    // convert to ADD
    aFunc = Cudd_BddToAdd( dd, bFunc );  Cudd_Ref( aFunc );
    Cudd_RecursiveDeref( dd, bFunc );

    // deref the intermediate results
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );

    Cudd_Deref( aFunc );
    return aFunc;
}